

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapMapInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapMapInfo *pSVar1;
  uint32 i;
  uint uVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->MapSize,CommaAndBigSpaceSeparator);
  if (pSVar1->MapSize != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (uVar2 = 0; uVar2 < pSVar1->MapSize; uVar2 = uVar2 + 2) {
      (*writer->_vptr_FileWriter[4])(writer,(ulong)(3 - (uVar2 == 0)));
      NSSnapValues::EmitTTDVar(pSVar1->MapKeyValueArray[uVar2],writer,NoSeparator);
      NSSnapValues::EmitTTDVar(pSVar1->MapKeyValueArray[uVar2 + 1],writer,CommaSeparator);
      (*writer->_vptr_FileWriter[5])(writer);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapMapInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapMapInfo* mapInfo = SnapObjectGetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject);

            writer->WriteLengthValue(mapInfo->MapSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(mapInfo->MapSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    writer->WriteSequenceStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i], writer, NSTokens::Separator::NoSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i + 1], writer, NSTokens::Separator::CommaSeparator);
                    writer->WriteSequenceEnd();
                }
                writer->WriteSequenceEnd();
            }
        }